

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_setfenv(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  lua_Number lVar2;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  lua_State *in_stack_00000010;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  int in_stack_0000006c;
  lua_State *in_stack_00000070;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffffc;
  
  luaL_checktype(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  getfunc(in_stack_00000070,in_stack_0000006c);
  lua_pushvalue((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc);
  iVar1 = lua_isnumber(in_stack_00000010,L._4_4_);
  if (iVar1 != 0) {
    lVar2 = lua_tonumber(L,unaff_retaddr_00);
    if ((lVar2 == 0.0) && (!NAN(lVar2))) {
      lua_pushthread(in_RDI);
      lua_insert(in_stack_00000020,in_stack_0000001c);
      lua_setfenv(in_stack_00000010,L._4_4_);
      return 0;
    }
  }
  iVar1 = lua_iscfunction((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                          in_stack_fffffffffffffffc);
  if ((iVar1 != 0) || (iVar1 = lua_setfenv(in_stack_00000010,L._4_4_), iVar1 == 0)) {
    luaL_error(in_RDI,"\'setfenv\' cannot change environment of given object");
  }
  return 1;
}

Assistant:

static int luaB_setfenv(lua_State*L){
luaL_checktype(L,2,5);
getfunc(L,0);
lua_pushvalue(L,2);
if(lua_isnumber(L,1)&&lua_tonumber(L,1)==0){
lua_pushthread(L);
lua_insert(L,-2);
lua_setfenv(L,-2);
return 0;
}
else if(lua_iscfunction(L,-2)||lua_setfenv(L,-2)==0)
luaL_error(L,
LUA_QL("setfenv")" cannot change environment of given object");
return 1;
}